

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

string * __thiscall
cppcms::http::context::skin_abi_cxx11_(string *__return_storage_ptr__,context *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&((this->d).ptr_)->skin);
  return __return_storage_ptr__;
}

Assistant:

std::string context::skin()
{
	return d->skin;
}